

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

uint Abc_TtCanonicize(word *pTruth,int nVars,char *pCanonPerm)

{
  int iVar1;
  uint uVar2;
  uint local_9c;
  char local_98 [4];
  int fChanges;
  char pCanonPermCopy [16];
  int fNaive;
  int nWords;
  int k;
  int i;
  uint uCanonPhase;
  int pStoreIn [17];
  char *pCanonPerm_local;
  int nVars_local;
  word *pTruth_local;
  
  unique0x100002b8 = pCanonPerm;
  iVar1 = Abc_TtWordNum(nVars);
  Abc_TtCopy(Abc_TtCanonicize::pCopy1,pTruth,iVar1,0);
  k = Abc_TtSemiCanonicize(pTruth,nVars,stack0xffffffffffffffe0,&i,0);
  for (fNaive = 0; fNaive < 5; fNaive = fNaive + 1) {
    local_9c = 0;
    for (nWords = nVars + -2; -1 < nWords; nWords = nWords + -1) {
      if ((&i)[nWords] == (&i)[nWords + 1]) {
        uVar2 = Abc_TtCofactorPerm(pTruth,nWords,iVar1,(uint)((&i)[nWords] != (&i)[nVars] / 2),
                                   stack0xffffffffffffffe0,(uint *)&k,1);
        local_9c = uVar2 | local_9c;
      }
    }
    if (local_9c == 0) break;
    local_9c = 0;
    for (nWords = 1; nWords < nVars + -1; nWords = nWords + 1) {
      if ((&i)[nWords] == (&i)[nWords + 1]) {
        uVar2 = Abc_TtCofactorPerm(pTruth,nWords,iVar1,(uint)((&i)[nWords] != (&i)[nVars] / 2),
                                   stack0xffffffffffffffe0,(uint *)&k,1);
        local_9c = uVar2 | local_9c;
      }
    }
    if (local_9c == 0) break;
  }
  Abc_TtCopy(Abc_TtCanonicize::pCopy2,pTruth,iVar1,0);
  memcpy(local_98,stack0xffffffffffffffe0,(long)nVars);
  Abc_TtImplementNpnConfig(Abc_TtCanonicize::pCopy2,nVars,local_98,k);
  iVar1 = Abc_TtEqual(Abc_TtCanonicize::pCopy1,Abc_TtCanonicize::pCopy2,iVar1);
  if (iVar1 == 0) {
    printf("Canonical form verification failed!\n");
  }
  return k;
}

Assistant:

unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm )
{
    int pStoreIn[17];
    unsigned uCanonPhase;
    int i, k, nWords = Abc_TtWordNum( nVars );
    int fNaive = 1;

#ifdef CANON_VERIFY
    char pCanonPermCopy[16];
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    uCanonPhase = Abc_TtSemiCanonicize( pTruth, nVars, pCanonPerm, pStoreIn, 0 );
    for ( k = 0; k < 5; k++ )
    {
        int fChanges = 0;
        for ( i = nVars - 2; i >= 0; i-- )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
        fChanges = 0;
        for ( i = 1; i < nVars - 1; i++ )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
    }

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    memcpy( pCanonPermCopy, pCanonPerm, sizeof(char) * nVars );
    Abc_TtImplementNpnConfig( pCopy2, nVars, pCanonPermCopy, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
/*
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
    {
        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        i = 0;
    }
*/
    return uCanonPhase;
}